

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::runTest
          (TransformFeedbackCase *this,DrawCall *first,DrawCall *end,deUint32 seed)

{
  char *pcVar1;
  ostringstream *poVar2;
  Precision PVar3;
  TextureFormat log;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var4;
  pointer puVar5;
  code *pcVar6;
  pointer puVar7;
  pointer ppAVar8;
  Attribute *pAVar9;
  RenderContext *pRVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  deUint32 dVar14;
  int iVar15;
  deUint32 dVar16;
  int iVar17;
  DataType DVar18;
  undefined4 uVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var21;
  void *__s;
  undefined8 *puVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  undefined8 uVar29;
  long lVar30;
  ulong uVar31;
  int bufNdx;
  int iVar32;
  DrawCall *pDVar33;
  byte bVar34;
  int primCount;
  int iVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  DrawCall *call_2;
  DrawCall *pDVar39;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  DrawCall *call_1;
  ulong uVar43;
  pointer pAVar44;
  DrawCall *call;
  pointer puVar45;
  ulong uVar46;
  pointer pOVar47;
  int iVar48;
  bool bVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  int local_304;
  int local_2e4;
  allocator<char> local_2d9;
  ulong local_2d8;
  DrawCall *local_2d0;
  DrawCall *local_2c8;
  pointer local_2c0;
  Random rnd;
  deUint32 available;
  Query primitiveQuery;
  deUint32 numPrimitives;
  ulong local_210;
  DrawCall *local_208;
  long local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputData;
  Surface frameWithoutTf;
  Surface frameWithTf;
  undefined1 local_1b0 [384];
  long lVar20;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2d0 = first;
  local_2c8 = end;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar12);
  deRandom_init(&rnd.m_rnd,seed);
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar12 = *(int *)CONCAT44(extraout_var_00,iVar12);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar13 = *(int *)(CONCAT44(extraout_var_01,iVar13) + 4);
  iVar32 = 0x80;
  if (iVar12 < 0x80) {
    iVar32 = iVar12;
  }
  iVar36 = 0x80;
  if (iVar13 < 0x80) {
    iVar36 = iVar13;
  }
  iVar12 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar12 - iVar32);
  iVar13 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar13 - iVar36);
  tcu::Surface::Surface(&frameWithTf,iVar32,iVar36);
  tcu::Surface::Surface(&frameWithoutTf,iVar32,iVar36);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper
            (&primitiveQuery,((this->super_TestCase).m_context)->m_renderCtx);
  dVar16 = this->m_primitiveType;
  local_2e4 = 0;
  uVar41 = 0;
  for (pDVar39 = local_2d0; pDVar39 != local_2c8; pDVar39 = pDVar39 + 1) {
    iVar17 = pDVar39->numElements;
    dVar14 = 0;
    if (pDVar39->transformFeedbackEnabled == true) {
      dVar14 = getTransformFeedbackOutputCount(dVar16,iVar17);
    }
    uVar41 = uVar41 + iVar17;
    local_2e4 = local_2e4 + dVar14;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&inputData,(long)(int)(this->m_inputStride * uVar41),(allocator_type *)local_1b0);
  puVar45 = inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar17 = this->m_inputStride;
  _Var21._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var4._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&available,"a_position",(allocator<char> *)&numPrimitives);
  std::__cxx11::string::string((string *)local_1b0,(string *)&available);
  _Var21 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var21,_Var4,(AttributeNameEquals *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&available);
  uVar37 = 0;
  uVar43 = (ulong)uVar41;
  if ((int)uVar41 < 1) {
    uVar43 = uVar37;
  }
  local_2d8 = uVar43;
  while (bVar49 = uVar43 != 0, uVar43 = uVar43 - 1, bVar49) {
    iVar48 = (_Var21._M_current)->offset;
    fVar51 = deRandom_getFloat(&rnd.m_rnd);
    iVar26 = (int)uVar37;
    *(float *)(puVar45 + (long)iVar26 + (long)iVar48) = fVar51 * 2.4 + -1.2;
    fVar51 = deRandom_getFloat(&rnd.m_rnd);
    *(float *)(puVar45 + (long)iVar26 + (long)iVar48 + 4) = fVar51 * 2.4 + -1.2;
    fVar51 = deRandom_getFloat(&rnd.m_rnd);
    *(float *)(puVar45 + (long)iVar26 + (long)iVar48 + 8) = fVar51 * 2.4 + -1.2;
    fVar51 = deRandom_getFloat(&rnd.m_rnd);
    *(float *)(puVar45 + (long)iVar26 + (long)iVar48 + 0xc) = fVar51 * 1.9 + 0.1;
    uVar37 = (ulong)(uint)(iVar26 + iVar17);
  }
  _Var21._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var4._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numPrimitives,"a_pointSize",&local_2d9);
  std::__cxx11::string::string((string *)&available,(string *)&numPrimitives);
  _Var21 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var21,_Var4,(AttributeNameEquals *)&available);
  std::__cxx11::string::~string((string *)&available);
  std::__cxx11::string::~string((string *)&numPrimitives);
  if (_Var21._M_current !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar48 = 0;
    uVar43 = local_2d8;
    while (bVar49 = uVar43 != 0, uVar43 = uVar43 - 1, bVar49) {
      iVar26 = (_Var21._M_current)->offset;
      fVar51 = deRandom_getFloat(&rnd.m_rnd);
      *(float *)(puVar45 + (long)iVar48 + (long)iVar26) = fVar51 * 7.0 + 1.0;
      iVar48 = iVar48 + iVar17;
    }
  }
  for (pAVar44 = (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pAVar44 !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar44 = pAVar44 + 1) {
    bVar49 = std::operator==(&pAVar44->name,"a_position");
    if ((!bVar49) && (bVar49 = std::operator==(&pAVar44->name,"a_pointSize"), !bVar49)) {
      DVar18 = (pAVar44->type).m_data.basic.type;
      PVar3 = (pAVar44->type).m_data.basic.precision;
      iVar48 = glu::getDataTypeScalarSize(DVar18);
      local_2c0 = (pointer)CONCAT44(local_2c0._4_4_,DVar18 - TYPE_INT);
      iVar26 = 0;
      local_304 = 0;
      if (iVar48 < 1) {
        iVar48 = 0;
      }
      for (; iVar42 = local_304, iVar35 = iVar48, iVar26 != (int)local_2d8; iVar26 = iVar26 + 1) {
        while (iVar35 != 0) {
          iVar15 = pAVar44->offset + iVar42;
          if (DVar18 - TYPE_FLOAT < 4) {
            if (PVar3 == PRECISION_HIGHP) {
              fVar51 = deRandom_getFloat(&rnd.m_rnd);
              fVar51 = fVar51 * 200000.0 + -100000.0;
            }
            else if (PVar3 == PRECISION_MEDIUMP) {
              fVar51 = deRandom_getFloat(&rnd.m_rnd);
              fVar51 = fVar51 * 2000.0 + -1000.0;
            }
            else {
              if (PVar3 != PRECISION_LOWP) goto LAB_0103ce2d;
              dVar16 = deRandom_getUint32(&rnd.m_rnd);
              fVar51 = (float)(dVar16 % 5) * 0.25 + 0.0;
            }
            *(float *)(puVar45 + iVar15) = fVar51;
          }
          else if ((uint)local_2c0 < 4) {
            if (PVar3 == PRECISION_HIGHP) {
              uVar41 = deRandom_getUint32(&rnd.m_rnd);
LAB_0103ce24:
              *(uint *)(puVar45 + iVar15) = uVar41;
            }
            else {
              if (PVar3 == PRECISION_MEDIUMP) {
                dVar16 = deRandom_getUint32(&rnd.m_rnd);
                uVar41 = dVar16 & 0xffff;
                uVar25 = (int)(short)dVar16 & 0xffff0000;
              }
              else {
                if (PVar3 != PRECISION_LOWP) goto LAB_0103ce2d;
                dVar16 = deRandom_getUint32(&rnd.m_rnd);
                uVar41 = dVar16 & 0xff;
                uVar25 = (int)(char)dVar16 & 0xffffff00;
              }
              *(uint *)(puVar45 + iVar15) = uVar25 | uVar41;
            }
          }
          else if (DVar18 - TYPE_UINT < 4) {
            if (PVar3 == PRECISION_HIGHP) {
              uVar41 = deRandom_getUint32(&rnd.m_rnd);
            }
            else if (PVar3 == PRECISION_MEDIUMP) {
              dVar16 = deRandom_getUint32(&rnd.m_rnd);
              uVar41 = dVar16 & 0xffff;
            }
            else {
              if (PVar3 != PRECISION_LOWP) goto LAB_0103ce2d;
              dVar16 = deRandom_getUint32(&rnd.m_rnd);
              uVar41 = dVar16 & 0xff;
            }
            goto LAB_0103ce24;
          }
LAB_0103ce2d:
          iVar42 = iVar42 + 4;
          iVar35 = iVar35 + -1;
        }
        local_304 = local_304 + iVar17;
      }
    }
  }
  (**(code **)(lVar20 + 0xd0))(0x8e22,(this->m_transformFeedback->super_ObjectWrapper).m_object);
  dVar16 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar16,"glBindTransformFeedback()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x449);
  for (uVar43 = 0;
      puVar5 = (this->m_outputBuffers).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      (long)uVar43 <
      (long)(int)((ulong)((long)(this->m_outputBuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 2);
      uVar43 = uVar43 + 1) {
    uVar41 = puVar5[uVar43];
    iVar17 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar43];
    (**(code **)(lVar20 + 0x40))(0x8c8e,uVar41);
    iVar48 = iVar17 * local_2e4;
    iVar17 = iVar17 * 2;
    (**(code **)(lVar20 + 0x150))(0x8c8e,(long)(iVar17 + iVar48),0,0x88e9);
    __s = (void *)(**(code **)(lVar20 + 0xd00))(0x8c8e,(long)iVar48,(long)iVar17,2);
    if (__s != (void *)0x0) {
      memset(__s,0xcd,(long)iVar17);
    }
    (**(code **)(lVar20 + 0x1670))(0x8c8e);
    dVar16 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar16,"guardband write",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x324);
    (**(code **)(lVar20 + 0x48))(0x8c8e,uVar43 & 0xffffffff,uVar41);
    dVar16 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar16,"transform feedback buffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x45c);
  }
  for (pAVar44 = (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pAVar44 !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar44 = pAVar44 + 1) {
    iVar17 = (**(code **)(lVar20 + 0x780))
                       ((this->m_program->m_program).m_program,(pAVar44->name)._M_dataplus._M_p);
    DVar18 = glu::getDataTypeScalarType((pAVar44->type).m_data.basic.type);
    iVar48 = glu::getDataTypeScalarSize((pAVar44->type).m_data.basic.type);
    if (-1 < iVar17) {
      puVar45 = inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + pAVar44->offset;
      (**(code **)(lVar20 + 0x610))(iVar17);
      if (DVar18 == TYPE_UINT) {
        uVar29 = 0x1405;
      }
      else {
        if (DVar18 != TYPE_INT) {
          if (DVar18 == TYPE_FLOAT) {
            (**(code **)(lVar20 + 0x19f0))(iVar17,iVar48,0x1406,0,this->m_inputStride,puVar45);
          }
          goto LAB_0103d066;
        }
        uVar29 = 0x1404;
      }
      (**(code **)(lVar20 + 0x1958))(iVar17,iVar48,uVar29,this->m_inputStride,puVar45);
    }
LAB_0103d066:
  }
  (**(code **)(lVar20 + 0x1a00))(iVar12,iVar13,iVar32,iVar36);
  pDVar39 = local_2d0;
  (**(code **)(lVar20 + 0x1680))((this->m_program->m_program).m_program);
  pcVar6 = *(code **)(lVar20 + 0x15a8);
  uVar19 = (**(code **)(lVar20 + 0xb48))((this->m_program->m_program).m_program,"u_scale");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b0,0.01);
  (*pcVar6)(uVar19,1,(Vector<float,_4> *)local_1b0);
  pcVar6 = *(code **)(lVar20 + 0x15a8);
  uVar19 = (**(code **)(lVar20 + 0xb48))((this->m_program->m_program).m_program,"u_bias");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b0,0.5);
  (*pcVar6)(uVar19,1,(Vector<float,_4> *)local_1b0);
  (**(code **)(lVar20 + 0x20))(0x8c88,primitiveQuery.super_ObjectWrapper.m_object);
  dVar16 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar16,"glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x47c);
  (**(code **)(lVar20 + 0x188))(0x4000);
  uVar19 = 0;
  if ((ulong)this->m_primitiveType < 7) {
    uVar19 = *(undefined4 *)(&DAT_0184a364 + (ulong)this->m_primitiveType * 4);
  }
  (**(code **)(lVar20 + 0x30))(uVar19);
  bVar34 = 1;
  iVar32 = 0;
  for (; pDVar33 = local_2d0, pDVar39 != local_2c8; pDVar39 = pDVar39 + 1) {
    if (pDVar39->transformFeedbackEnabled != (bool)(bVar34 & 1)) {
      puVar22 = (undefined8 *)(lVar20 + 0xfe0);
      if (pDVar39->transformFeedbackEnabled != false) {
        puVar22 = (undefined8 *)(lVar20 + 0x1248);
      }
      (*(code *)*puVar22)();
      bVar34 = pDVar39->transformFeedbackEnabled;
    }
    (**(code **)(lVar20 + 0x538))(this->m_primitiveType,iVar32,pDVar39->numElements);
    iVar32 = iVar32 + pDVar39->numElements;
  }
  if ((bVar34 & 1) == 0) {
    (**(code **)(lVar20 + 0x1248))();
  }
  (**(code **)(lVar20 + 0x638))();
  dVar16 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar16,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x49c);
  (**(code **)(lVar20 + 0x628))(0x8c88);
  dVar16 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar16,"glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a0);
  available = 0;
  (**(code **)(lVar20 + 0xa20))(primitiveQuery.super_ObjectWrapper.m_object,0x8867);
  dVar16 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar16,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a6);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: "
                 );
  pcVar1 = "mapped_ == GL_TRUE";
  if (available == 0) {
    pcVar1 = "mapped_ == GL_FALSE";
  }
  std::operator<<((ostream *)poVar2,pcVar1 + 0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  bVar34 = 1;
  uVar43 = 0;
  while( true ) {
    puVar5 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)(int)((ulong)((long)puVar7 - (long)puVar5) >> 2) <= (long)uVar43) break;
    iVar32 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar43];
    (**(code **)(lVar20 + 0x40))(0x8c8e,puVar5[uVar43]);
    local_210 = (ulong)(uint)(iVar32 * local_2e4);
    uVar41 = iVar32 * 2;
    lVar23 = (**(code **)(lVar20 + 0xd00))(0x8c8e,0,(long)(int)(uVar41 + iVar32 * local_2e4),1);
    dVar16 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar16,"mapping buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x4b7);
    for (pOVar47 = (this->m_transformFeedbackOutputs).
                   super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pOVar47 !=
        (this->m_transformFeedbackOutputs).
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
        ._M_impl.super__Vector_impl_data._M_finish; pOVar47 = pOVar47 + 1) {
      if (uVar43 == (uint)pOVar47->bufferNdx) {
        iVar17 = 0;
        iVar36 = 0;
        for (pDVar39 = pDVar33;
            puVar45 = inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start, pDVar39 != local_2c8;
            pDVar39 = pDVar39 + 1) {
          bVar24 = pDVar39->transformFeedbackEnabled;
          iVar48 = pDVar39->numElements;
          if ((bool)bVar24 == true) {
            dVar16 = this->m_primitiveType;
            iVar26 = this->m_inputStride;
            uVar25 = pOVar47->offset;
            lVar30 = 0;
            local_2c0 = pOVar47;
            local_208 = pDVar39;
            while( true ) {
              local_2d8 = (ulong)uVar25;
              ppAVar8 = (local_2c0->inputs).
                        super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((int)((ulong)((long)(local_2c0->inputs).
                                      super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar8) >>
                       3) <= lVar30) break;
              pAVar9 = ppAVar8[lVar30];
              DVar18 = (pAVar9->type).m_data.basic.type;
              local_200 = lVar30;
              uVar25 = glu::getDataTypeScalarSize(DVar18);
              PVar3 = (pAVar9->type).m_data.basic.precision;
              DVar18 = glu::getDataTypeScalarType(DVar18);
              dVar14 = getTransformFeedbackOutputCount(dVar16,iVar48);
              uVar31 = 0;
              uVar37 = 0;
              if (0 < (int)uVar25) {
                uVar37 = (ulong)uVar25;
              }
              uVar27 = (ulong)dVar14;
              if ((int)dVar14 < 1) {
                uVar27 = uVar31;
              }
              for (uVar40 = 0; uVar40 != uVar27; uVar40 = uVar40 + 1) {
                iVar42 = (int)uVar40;
                if (dVar16 < 7) {
                  iVar35 = iVar42;
                  switch(dVar16) {
                  case 2:
                    iVar35 = (int)((long)((ulong)(uint)(iVar42 >> 0x1f) << 0x20 |
                                         uVar40 & 0xffffffff) / -2) + iVar42;
                    if (iVar48 <= iVar35) {
                      iVar35 = 0;
                    }
                    break;
                  case 3:
                    iVar35 = (int)((long)((ulong)(uint)(iVar42 >> 0x1f) << 0x20 |
                                         uVar40 & 0xffffffff) / -2) + iVar42;
                    break;
                  case 5:
                    uVar46 = (uVar40 & 0xffffffff) / 3;
                    iVar35 = (int)uVar46;
                    uVar28 = (uint)((uVar40 & 0xffffffff) % 3);
                    iVar15 = iVar35 + uVar28;
                    iVar35 = (iVar35 - uVar28) + 1;
                    if ((uVar46 & 1) == 0) {
                      iVar35 = iVar15;
                    }
                    if (1 < uVar28) {
                      iVar35 = iVar15;
                    }
                    break;
                  case 6:
                    iVar15 = (int)((uVar40 & 0xffffffff) % 3);
                    iVar35 = 0;
                    if (iVar15 != 0) {
                      iVar35 = (int)((uVar40 & 0xffffffff) / 3) + iVar15;
                    }
                  }
                }
                else {
                  iVar35 = 0;
                }
                for (uVar46 = 0; uVar37 != uVar46; uVar46 = uVar46 + 1) {
                  fVar51 = *(float *)(puVar45 +
                                     uVar46 * 4 +
                                     (long)pAVar9->offset +
                                     (long)(iVar35 * iVar26) + (long)(iVar26 * iVar17));
                  fVar52 = *(float *)((long)(int)uVar31 +
                                      (long)(int)local_2d8 + iVar36 * iVar32 + lVar23 + uVar46 * 4);
                  if (DVar18 == TYPE_FLOAT) {
                    if (PVar3 == PRECISION_LOWP) {
                      fVar51 = fVar51 - fVar52;
                      fVar52 = -fVar51;
                      if (-fVar51 <= fVar51) {
                        fVar52 = fVar51;
                      }
                      if (fVar52 < 0.1) goto LAB_0103d6a0;
                    }
                    else if (PVar3 == PRECISION_MEDIUMP) {
                      iVar38 = (int)fVar51 - (int)fVar52;
                      iVar15 = -iVar38;
                      if (0 < iVar38) {
                        iVar15 = iVar38;
                      }
                      if (iVar15 < 0x2002) goto LAB_0103d6a0;
                    }
                    else if (PVar3 == PRECISION_HIGHP) {
                      iVar38 = (int)fVar51 - (int)fVar52;
                      iVar15 = -iVar38;
                      if (0 < iVar38) {
                        iVar15 = iVar38;
                      }
                      if (iVar15 < 2) goto LAB_0103d6a0;
                    }
LAB_0103d73b:
                    poVar2 = (ostringstream *)(local_1b0 + 8);
                    local_1b0._0_8_ = log;
                    std::__cxx11::ostringstream::ostringstream(poVar2);
                    std::operator<<((ostream *)poVar2,"Mismatch in ");
                    std::operator<<((ostream *)poVar2,(string *)local_2c0);
                    std::operator<<((ostream *)poVar2," (");
                    std::operator<<((ostream *)poVar2,(string *)pAVar9);
                    std::operator<<((ostream *)poVar2,"), output = ");
                    std::ostream::operator<<(poVar2,iVar42);
                    std::operator<<((ostream *)poVar2,", input = ");
                    std::ostream::operator<<(poVar2,iVar35);
                    std::operator<<((ostream *)poVar2,", component = ");
                    std::ostream::operator<<(poVar2,(int)uVar46);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(poVar2);
                    bVar34 = 0;
                    pDVar33 = local_2d0;
                    pOVar47 = local_2c0;
                    goto LAB_0103d810;
                  }
                  if (fVar51 != fVar52) goto LAB_0103d73b;
LAB_0103d6a0:
                }
                uVar31 = (ulong)(uint)((int)uVar31 + iVar32);
              }
              uVar25 = (int)local_2d8 + uVar25 * 4;
              lVar30 = local_200 + 1;
              pDVar33 = local_2d0;
            }
            iVar48 = local_208->numElements;
            bVar24 = local_208->transformFeedbackEnabled;
            pOVar47 = local_2c0;
            pDVar39 = local_208;
          }
          dVar16 = 0;
          if ((bVar24 & 1) != 0) {
            dVar16 = getTransformFeedbackOutputCount(this->m_primitiveType,iVar48);
          }
          iVar17 = iVar17 + iVar48;
          iVar36 = iVar36 + dVar16;
        }
      }
LAB_0103d810:
    }
    uVar37 = 0;
    if (0 < (int)uVar41) {
      uVar37 = (ulong)uVar41;
    }
    uVar31 = 0xffffffffffffffff;
    do {
      uVar27 = uVar37;
      if (uVar31 - uVar37 == -1) break;
      uVar27 = uVar31 + 1;
      pcVar1 = (char *)(lVar23 + (int)local_210 + 1 + uVar31);
      uVar31 = uVar27;
    } while (*pcVar1 == -0x33);
    if ((long)uVar27 < (long)(int)uVar41) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Error: Transform feedback buffer overrun detected"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      bVar34 = 0;
    }
    (**(code **)(lVar20 + 0x1670))(0x8c8e);
    uVar43 = uVar43 + 1;
  }
  dVar16 = 0;
  pDVar39 = pDVar33;
  do {
    if (pDVar39 == local_2c8) {
      available = 0;
      numPrimitives = 0;
      (**(code **)(lVar20 + 0xa20))(primitiveQuery.super_ObjectWrapper.m_object,0x8867);
      (**(code **)(lVar20 + 0xa20))
                (primitiveQuery.super_ObjectWrapper.m_object,0x8866,&numPrimitives);
      dVar14 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar14,"glGetQueryObjectuiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x4e9);
      bVar49 = available != 0;
      if (!bVar49 && puVar5 == puVar7) {
        poVar2 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      poVar2 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      bVar50 = numPrimitives == dVar16;
      if (!bVar50) {
        poVar2 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR: Expected ");
        std::ostream::operator<<(poVar2,dVar16);
        std::operator<<((ostream *)poVar2," primitives!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      (**(code **)(lVar20 + 0xd0))(0x8e22,0);
      for (iVar32 = 0;
          iVar32 < (int)((ulong)((long)(this->m_outputBuffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_outputBuffers).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2);
          iVar32 = iVar32 + 1) {
        (**(code **)(lVar20 + 0x40))(0x8c8e,0);
        (**(code **)(lVar20 + 0x48))(0x8c8e,iVar32,0);
      }
      pRVar10 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&frameWithTf);
      glu::readPixels(pRVar10,iVar12,iVar13,(PixelBufferAccess *)local_1b0);
      (**(code **)(lVar20 + 0x188))(0x4000);
      iVar32 = 0;
      for (; pDVar33 != local_2c8; pDVar33 = pDVar33 + 1) {
        (**(code **)(lVar20 + 0x538))(this->m_primitiveType,iVar32,pDVar33->numElements);
        iVar32 = iVar32 + pDVar33->numElements;
      }
      dVar16 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar16,"render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x511);
      pRVar10 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&frameWithoutTf);
      glu::readPixels(pRVar10,iVar12,iVar13,(PixelBufferAccess *)local_1b0);
      local_1b0._0_4_ = 0x1010101;
      bVar11 = tcu::pixelThresholdCompare
                         ((TestLog *)log,"Result","Image comparison result",&frameWithoutTf,
                          &frameWithTf,(RGBA *)local_1b0,COMPARE_LOG_ON_ERROR);
      if (bVar11) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "Rendering result comparison between TF enabled and TF disabled passed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "ERROR: Rendering result comparison between TF enabled and TF disabled failed!"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      glu::ObjectWrapper::~ObjectWrapper(&primitiveQuery.super_ObjectWrapper);
      tcu::Surface::~Surface(&frameWithoutTf);
      tcu::Surface::~Surface(&frameWithTf);
      return (bool)(bVar34 & (bVar50 && (bVar49 || puVar5 != puVar7)) & bVar11);
    }
    if (pDVar39->transformFeedbackEnabled != true) goto LAB_0103d94b;
    if (6 < this->m_primitiveType) {
      iVar32 = 0;
      goto switchD_0103d920_caseD_0;
    }
    iVar32 = pDVar39->numElements;
    switch(this->m_primitiveType) {
    case 0:
      break;
    case 1:
      iVar36 = 2;
      goto LAB_0103d944;
    case 2:
      if (iVar32 < 2) {
        iVar32 = 0;
      }
      break;
    case 3:
      iVar32 = iVar32 + -1;
      goto LAB_0103d93a;
    case 4:
      iVar36 = 3;
LAB_0103d944:
      iVar32 = iVar32 / iVar36;
      break;
    default:
      iVar32 = iVar32 + -2;
LAB_0103d93a:
      if (iVar32 < 1) {
        iVar32 = 0;
      }
    }
switchD_0103d920_caseD_0:
    dVar16 = dVar16 + iVar32;
LAB_0103d94b:
    pDVar39 = pDVar39 + 1;
  } while( true );
}

Assistant:

bool TransformFeedbackCase::runTest (const DrawCall* first, const DrawCall* end, deUint32 seed)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	de::Random				rnd				(seed);
	int						numInputs		= 0;		//!< Sum of element counts in calls.
	int						numOutputs		= 0;		//!< Sum of output counts for calls that have transform feedback enabled.
	int						width			= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height			= m_context.getRenderContext().getRenderTarget().getHeight();
	int						viewportW		= de::min((int)VIEWPORT_WIDTH, width);
	int						viewportH		= de::min((int)VIEWPORT_HEIGHT, height);
	int						viewportX		= rnd.getInt(0, width-viewportW);
	int						viewportY		= rnd.getInt(0, height-viewportH);
	tcu::Surface			frameWithTf		(viewportW, viewportH);
	tcu::Surface			frameWithoutTf	(viewportW, viewportH);
	glu::Query				primitiveQuery	(m_context.getRenderContext());
	bool					outputsOk		= true;
	bool					imagesOk		= true;
	bool					queryOk			= true;

	// Compute totals.
	for (const DrawCall* call = first; call != end; call++)
	{
		numInputs	+= call->numElements;
		numOutputs	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
	}

	// Input data.
	vector<deUint8> inputData(m_inputStride*numInputs);
	genInputData(m_attributes, numInputs, m_inputStride, &inputData[0], rnd);

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transformFeedback->get());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback()");

	// Allocate storage for transform feedback output buffers and bind to targets.
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufNdx];
		int				stride		= m_bufferStrides[bufNdx];
		int				target		= bufNdx;
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const deUint32	usage		= GL_DYNAMIC_READ;

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, size+guardSize, DE_NULL, usage);
		writeBufferGuard(gl, GL_TRANSFORM_FEEDBACK_BUFFER, size, guardSize);

		// \todo [2012-07-30 pyry] glBindBufferRange()?
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, target, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "transform feedback buffer setup");
	}

	// Setup attributes.
	for (vector<Attribute>::const_iterator attrib = m_attributes.begin(); attrib != m_attributes.end(); attrib++)
	{
		int				loc				= gl.getAttribLocation(m_program->getProgram(), attrib->name.c_str());
		glu::DataType	scalarType		= glu::getDataTypeScalarType(attrib->type.getBasicType());
		int				numComponents	= glu::getDataTypeScalarSize(attrib->type.getBasicType());
		const void*		ptr				= &inputData[0] + attrib->offset;

		if (loc >= 0)
		{
			gl.enableVertexAttribArray(loc);

			if (scalarType == glu::TYPE_FLOAT)		gl.vertexAttribPointer	(loc, numComponents, GL_FLOAT, GL_FALSE, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_INT)	gl.vertexAttribIPointer	(loc, numComponents, GL_INT, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_UINT)	gl.vertexAttribIPointer	(loc, numComponents, GL_UNSIGNED_INT, m_inputStride, ptr);
		}
	}

	// Setup viewport.
	gl.viewport(viewportX, viewportY, viewportW, viewportH);

	// Setup program.
	gl.useProgram(m_program->getProgram());

	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_scale"),	1, tcu::Vec4(0.01f).getPtr());
	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_bias"),		1, tcu::Vec4(0.5f).getPtr());

	// Enable query.
	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *primitiveQuery);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Draw.
	{
		int		offset		= 0;
		bool	tfEnabled	= true;

		gl.clear(GL_COLOR_BUFFER_BIT);

		gl.beginTransformFeedback(getTransformFeedbackPrimitiveMode(m_primitiveType));

		for (const DrawCall* call = first; call != end; call++)
		{
			// Pause or resume transform feedback if necessary.
			if (call->transformFeedbackEnabled != tfEnabled)
			{
				if (call->transformFeedbackEnabled)
					gl.resumeTransformFeedback();
				else
					gl.pauseTransformFeedback();
				tfEnabled = call->transformFeedbackEnabled;
			}

			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		// Resume feedback before finishing it.
		if (!tfEnabled)
			gl.resumeTransformFeedback();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
	}

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Check and log query status right after submit
	{
		deUint32 available = GL_FALSE;
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: " << (available != GL_FALSE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	}

	// Compare result buffers.
	for (int bufferNdx = 0; bufferNdx < (int)m_outputBuffers.size(); bufferNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufferNdx];
		int				stride		= m_bufferStrides[bufferNdx];
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const void*		bufPtr		= DE_NULL;

		// Bind buffer for reading.
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		bufPtr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, size+guardSize, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapping buffer");

		// Verify all output variables that are written to this buffer.
		for (vector<Output>::const_iterator out = m_transformFeedbackOutputs.begin(); out != m_transformFeedbackOutputs.end(); out++)
		{
			if (out->bufferNdx != bufferNdx)
				continue;

			int inputOffset		= 0;
			int	outputOffset	= 0;

			// Process all draw calls and check ones with transform feedback enabled.
			for (const DrawCall* call = first; call != end; call++)
			{
				if (call->transformFeedbackEnabled)
				{
					const deUint8*	inputPtr	= &inputData[0] + inputOffset*m_inputStride;
					const deUint8*	outputPtr	= (const deUint8*)bufPtr + outputOffset*stride;

					if (!compareTransformFeedbackOutput(log, m_primitiveType, *out, call->numElements, inputPtr, m_inputStride, outputPtr, stride))
					{
						outputsOk = false;
						break;
					}
				}

				inputOffset		+= call->numElements;
				outputOffset	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
			}
		}

		// Verify guardband.
		if (!verifyGuard((const deUint8*)bufPtr + size, guardSize))
		{
			log << TestLog::Message << "Error: Transform feedback buffer overrun detected" << TestLog::EndMessage;
			outputsOk = false;
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	// Check status after mapping buffers.
	{
		const bool	mustBeReady		= !m_outputBuffers.empty(); // Mapping buffer forces synchronization.
		const int	expectedCount	= computeTransformFeedbackPrimitiveCount(m_primitiveType, first, end);
		deUint32	available		= GL_FALSE;
		deUint32	numPrimitives	= 0;

		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT, &numPrimitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		if (!mustBeReady && available == GL_FALSE)
		{
			log << TestLog::Message << "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!" << TestLog::EndMessage;
			queryOk = false;
		}

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = " << numPrimitives << TestLog::EndMessage;

		if ((int)numPrimitives != expectedCount)
		{
			log << TestLog::Message << "ERROR: Expected " << expectedCount << " primitives!" << TestLog::EndMessage;
			queryOk = false;
		}
	}

	// Clear transform feedback state.
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		gl.bindBuffer		(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.bindBufferBase	(GL_TRANSFORM_FEEDBACK_BUFFER, bufNdx, 0);
	}

	// Read back rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithTf.getAccess());

	// Render without transform feedback.
	{
		int offset = 0;

		gl.clear(GL_COLOR_BUFFER_BIT);

		for (const DrawCall* call = first; call != end; call++)
		{
			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithoutTf.getAccess());
	}

	// Compare images with and without transform feedback.
	imagesOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", frameWithoutTf, frameWithTf, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_ON_ERROR);

	if (imagesOk)
		m_testCtx.getLog() << TestLog::Message << "Rendering result comparison between TF enabled and TF disabled passed." << TestLog::EndMessage;
	else
		m_testCtx.getLog() << TestLog::Message << "ERROR: Rendering result comparison between TF enabled and TF disabled failed!" << TestLog::EndMessage;

	return outputsOk && imagesOk && queryOk;
}